

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcondvariable-posix.c
# Opt level: O0

PCondVariable * p_cond_variable_new(void)

{
  int iVar1;
  PCondVariable *ret;
  
  ret = (PCondVariable *)p_malloc0(0x30);
  if ((pthread_cond_t *)ret == (pthread_cond_t *)0x0) {
    printf("** Error: %s **\n","PCondVariable::p_cond_variable_new: failed to allocate memory");
    ret = (PCondVariable *)0x0;
  }
  else {
    iVar1 = pthread_cond_init((pthread_cond_t *)ret,(pthread_condattr_t *)0x0);
    if (iVar1 != 0) {
      printf("** Error: %s **\n","PCondVariable::p_cond_variable_new: failed to initialize");
      p_free(ret);
      ret = (PCondVariable *)0x0;
    }
  }
  return ret;
}

Assistant:

P_LIB_API PCondVariable *
p_cond_variable_new (void)
{
	PCondVariable *ret;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PCondVariable))) == NULL)) {
		P_ERROR ("PCondVariable::p_cond_variable_new: failed to allocate memory");
		return NULL;
	}

	if (P_UNLIKELY (pthread_cond_init (&ret->hdl, NULL) != 0)) {
		P_ERROR ("PCondVariable::p_cond_variable_new: failed to initialize");
		p_free (ret);
		return NULL;
	}

	return ret;
}